

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int ncnn::gemm_BT_x86(Mat *A,Mat *BT,Mat *C,Mat *top_blob,int broadcast_type_C,int N,int K,
                     int transA,int output_transpose,int constant_TILE_M,int constant_TILE_N,
                     int constant_TILE_K,int nT,Option *opt)

{
  undefined4 in_stack_00000038;
  bool k_end;
  Mat BT_tile;
  Mat AT_tile;
  int max_kk;
  int k;
  Mat *CT_tile;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  int ppi;
  Mat topT;
  Mat ATX;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int M;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  undefined4 in_stack_fffffffffffff704;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  int in_stack_fffffffffffff714;
  int in_stack_fffffffffffff718;
  int in_stack_fffffffffffff71c;
  Mat *in_stack_fffffffffffff720;
  undefined8 in_stack_fffffffffffff760;
  int in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  int in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  int *in_stack_fffffffffffff780;
  int *in_stack_fffffffffffff788;
  int *in_stack_fffffffffffff790;
  int in_stack_fffffffffffff798;
  
  get_optimal_tile_mnk
            (in_stack_fffffffffffff774,in_stack_fffffffffffff770,in_stack_fffffffffffff76c,
             in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20),
             (int)in_stack_fffffffffffff760,in_stack_fffffffffffff780,in_stack_fffffffffffff788,
             in_stack_fffffffffffff790,in_stack_fffffffffffff798);
  Mat::create(in_stack_fffffffffffff720,in_stack_fffffffffffff71c,in_stack_fffffffffffff718,
              in_stack_fffffffffffff714,
              CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
              (Allocator *)CONCAT44(in_stack_fffffffffffff704,in_stack_00000038));
  return -100;
}

Assistant:

static int gemm_BT_x86(const Mat& A, const Mat& BT, const Mat& C, Mat& top_blob, int broadcast_type_C, int N, int K, int transA, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    if (ATX.empty())
        return -100;

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}